

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void __thiscall
ft::list<double,_ft::allocator<double>_>::listInit(list<double,_ft::allocator<double>_> *this)

{
  listNode<double> *plVar1;
  node *pnVar2;
  listNode<double> local_38;
  
  pnVar2 = (node *)operator_new(0x18);
  this->m_head = pnVar2;
  pnVar2 = (node *)operator_new(0x18);
  this->m_tail = pnVar2;
  local_38.data = 0.0;
  local_38.prev = (listNode<double> *)0x0;
  local_38.next = (listNode<double> *)0x0;
  listNode<double>::listNode(this->m_head,&local_38);
  local_38.data = 0.0;
  local_38.prev = (listNode<double> *)0x0;
  local_38.next = (listNode<double> *)0x0;
  listNode<double>::listNode(this->m_tail,&local_38);
  pnVar2 = this->m_head;
  plVar1 = this->m_tail;
  pnVar2->next = plVar1;
  plVar1->prev = pnVar2;
  return;
}

Assistant:

void listInit() {
		this->m_head = this->m_alloc.allocate(1);
		this->m_tail = this->m_alloc.allocate(1);
		this->m_alloc.construct(this->m_head, node());
		this->m_alloc.construct(this->m_tail, node());
		this->head()->next = this->tail();
		this->tail()->prev = this->head();
	}